

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

void __thiscall QSyntaxHighlighter::rehighlight(QSyntaxHighlighter *this)

{
  bool bVar1;
  QSyntaxHighlighterPrivate *pQVar2;
  QTextDocument *in_RDI;
  long in_FS_OFFSET;
  QTextCursor *unaff_retaddr;
  QSyntaxHighlighterPrivate *d;
  QTextCursor cursor;
  QTextCursor *this_00;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSyntaxHighlighter *)0x79af65);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTextDocument> *)0x79af78);
  if (bVar1) {
    this_00 = (QTextCursor *)&DAT_aaaaaaaaaaaaaaaa;
    ::QPointer::operator_cast_to_QTextDocument_((QPointer<QTextDocument> *)0x79af98);
    QTextCursor::QTextCursor(this_00,in_RDI);
    QSyntaxHighlighterPrivate::rehighlight(d,unaff_retaddr,(MoveOperation)((ulong)lVar3 >> 0x20));
    pQVar2->rehighlightPending = false;
    QTextCursor::~QTextCursor((QTextCursor *)0x79afcf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighter::rehighlight()
{
    Q_D(QSyntaxHighlighter);
    if (!d->doc)
        return;

    QTextCursor cursor(d->doc);
    d->rehighlight(cursor, QTextCursor::End);
    d->rehighlightPending = false; // user manually did a full rehighlight
}